

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_scan.cc
# Opt level: O3

int __thiscall hwtest::pgraph::anon_unknown_2::ScanContextTest::run(ScanContextTest *this)

{
  uint uVar1;
  Register *pRVar2;
  nva_card **ppnVar3;
  int iVar4;
  uint32_t all0;
  nva_card **in_RCX;
  uint32_t all1;
  uint32_t reg_00;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *reg;
  pointer puVar5;
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  local_40;
  
  ppnVar3 = nva_cards;
  iVar4 = (this->super_ScanTest).super_Test.chipset.card_type;
  if (iVar4 < 3) {
    *(undefined4 *)((long)nva_cards[(this->super_ScanTest).super_Test.cnum]->bar0 + 0x4006a4) =
         0xf000111;
    iVar4 = (this->super_ScanTest).super_Test.chipset.card_type;
    in_RCX = ppnVar3;
  }
  ppnVar3 = nva_cards;
  if (iVar4 == 4) {
    *(undefined4 *)((long)nva_cards[(this->super_ScanTest).super_Test.cnum]->bar0 + 0x40008c) =
         0x1000000;
    in_RCX = ppnVar3;
  }
  pgraph_rop_regs(&local_40,&(this->super_ScanTest).super_Test.chipset);
  all0 = (uint32_t)in_RCX;
  if (local_40.
      super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_40.
      super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar5 = local_40.
             super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pRVar2 = (puVar5->_M_t).
               super___uniq_ptr_impl<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
               ._M_t.
               super__Tuple_impl<0UL,_hwtest::pgraph::Register_*,_std::default_delete<hwtest::pgraph::Register>_>
               .super__Head_base<0UL,_hwtest::pgraph::Register_*,_false>._M_head_impl;
      iVar4 = (*pRVar2->_vptr_Register[10])
                        (pRVar2,(ulong)(uint)(this->super_ScanTest).super_Test.cnum,
                         &(this->super_ScanTest).super_Test.rnd);
      all0 = (uint32_t)in_RCX;
      if ((char)iVar4 != '\0') {
        (this->super_ScanTest).res = 3;
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != local_40.
                       super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  ::~vector(&local_40);
  uVar1 = (this->super_ScanTest).super_Test.chipset.card_type;
  if ((int)uVar1 < 4) {
    ScanTest::bitscan(&this->super_ScanTest,0x400680,0xffff,all0);
    reg_00 = 0x400684;
    if (uVar1 == 3) {
      ScanTest::bitscan(&this->super_ScanTest,0x400684,0xf1ffff,all0);
      ScanTest::bitscan(&this->super_ScanTest,0x400688,0xffff,all0);
      reg_00 = 0x40068c;
      all1 = 0x1ffff;
    }
    else {
      all1 = 0x11ffff;
    }
  }
  else if (uVar1 < 0x10) {
    reg_00 = 0x400714;
    all1 = 0x110101;
  }
  else {
    reg_00 = 0x400718;
    all1 = 0x73110101;
  }
  ScanTest::bitscan(&this->super_ScanTest,reg_00,all1,all0);
  return (this->super_ScanTest).res;
}

Assistant:

int run() override {
		if (chipset.card_type < 3) {
			nva_wr32(cnum, 0x4006a4, 0x0f000111);
		}
		if (chipset.card_type == 4)
			nva_wr32(cnum, 0x40008c, 0x01000000);
		for (auto &reg : pgraph_rop_regs(chipset)) {
			if (reg->scan_test(cnum, rnd))
				res = HWTEST_RES_FAIL;
		}
		if (chipset.card_type < 4) {
			if (chipset.card_type < 3) {
				bitscan(0x400680, 0x0000ffff, 0);
				bitscan(0x400684, 0x0011ffff, 0);
			} else {
				bitscan(0x400680, 0x0000ffff, 0);
				bitscan(0x400684, 0x00f1ffff, 0);
				bitscan(0x400688, 0x0000ffff, 0);
				bitscan(0x40068c, 0x0001ffff, 0);
			}
		} else {
			if (chipset.card_type < 0x10) {
				bitscan(0x400714, 0x00110101, 0);
			} else {
				bitscan(0x400718, 0x73110101, 0);
			}
		}
		return res;
	}